

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_7::Validator::OnAtomicLoadExpr(Validator *this,AtomicLoadExpr *expr)

{
  undefined1 *loc;
  Address alignment;
  Address natural_alignment;
  
  loc = &expr->field_0x18;
  this->expr_loc_ = (Location *)loc;
  CheckHasSharedMemory(this,(Location *)loc,(Opcode)(expr->opcode).enum_);
  alignment = expr->align;
  natural_alignment = get_opcode_natural_alignment((Opcode)(expr->opcode).enum_);
  CheckAtomicAlign(this,(Location *)loc,alignment,natural_alignment);
  TypeChecker::OnAtomicLoad(&this->typechecker_,(Opcode)(expr->opcode).enum_);
  return (Result)Ok;
}

Assistant:

Result Validator::OnAtomicLoadExpr(AtomicLoadExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckAtomicExpr(expr, &TypeChecker::OnAtomicLoad);
  return Result::Ok;
}